

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O1

bool wallet::IsBDBFile(path *path)

{
  pointer pcVar1;
  string_view source_file;
  char cVar2;
  bool bVar3;
  ulong uVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  error_code ec;
  ifstream file;
  uint32_t data;
  error_code local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long *local_d8 [2];
  long local_c8 [14];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::filesystem::status(&path->super_path);
  bVar3 = false;
  if ((cVar2 != '\0') && (bVar3 = false, cVar2 != -1)) {
    local_318._M_value = 0;
    local_318._M_cat = (error_category *)std::_V2::system_category();
    uVar4 = std::filesystem::file_size(&path->super_path,&local_318);
    if (local_318._M_value != 0) {
      (**(code **)(*(long *)local_318._M_cat + 0x20))(local_d8);
      pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length
                );
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar5);
      if (bVar3) {
        local_300[0]._M_string_length = 0;
        local_300[0].field_2._M_local_buf[0] = '\0';
        local_300[0]._M_dataplus._M_p = (pointer)&local_300[0].field_2;
        tinyformat::format<char[10],std::__cxx11::string,std::__cxx11::string>
                  (&local_58,(tinyformat *)"%s: %s %s\n","IsBDBFile",(char (*) [10])local_d8,
                   &local_f8,in_R9);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (local_300,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar5 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x56;
        local_58._M_string_length = 0x873036;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/db.cpp"
        ;
        source_file._M_len = 0x56;
        str._M_str = local_300[0]._M_dataplus._M_p;
        str._M_len = local_300[0]._M_string_length;
        logging_function._M_str = "IsBDBFile";
        logging_function._M_len = 9;
        BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x67,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300[0]._M_dataplus._M_p != &local_300[0].field_2) {
          operator_delete(local_300[0]._M_dataplus._M_p,
                          CONCAT71(local_300[0].field_2._M_allocated_capacity._1_7_,
                                   local_300[0].field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
    }
    if (uVar4 < 0x1000) {
      bVar3 = false;
    }
    else {
      std::ifstream::ifstream(local_300,(path->super_path)._M_pathname._M_dataplus._M_p,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        bVar3 = false;
      }
      else {
        std::istream::seekg((long)local_300,0xc);
        local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
        std::istream::read((char *)local_300,(long)&local_58);
        bVar3 = (int)local_58._M_dataplus._M_p == 0x62310500 ||
                (int)local_58._M_dataplus._M_p == 0x53162;
      }
      std::ifstream::~ifstream(local_300);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBDBFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A Berkeley DB Btree file has at least 4K.
    // This check also prevents opening lock files.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 4096) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    file.seekg(12, std::ios::beg); // Magic bytes start at offset 12
    uint32_t data = 0;
    file.read((char*) &data, sizeof(data)); // Read 4 bytes of file to compare against magic

    // Berkeley DB Btree magic bytes, from:
    //  https://github.com/file/file/blob/5824af38469ec1ca9ac3ffd251e7afe9dc11e227/magic/Magdir/database#L74-L75
    //  - big endian systems - 00 05 31 62
    //  - little endian systems - 62 31 05 00
    return data == 0x00053162 || data == 0x62310500;
}